

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRedcostFixing.cpp
# Opt level: O0

void __thiscall
HighsRedcostFixing::addRootRedcost
          (HighsRedcostFixing *this,HighsMipSolver *mipsolver,
          vector<double,_std::allocator<double>_> *lpredcost,double lpobjective)

{
  bool bVar1;
  int iVar2;
  pointer pHVar3;
  reference piVar4;
  const_reference pvVar5;
  reference pvVar6;
  pointer ppVar7;
  vector<double,_std::allocator<double>_> *in_RDX;
  HighsMipSolver *in_RSI;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar8;
  _Self del_1;
  iterator i_1;
  iterator it_2;
  iterator it_3;
  iterator pos_1;
  bool useful_1;
  double requiredcutoffbound_1;
  double fracbound_1;
  HighsInt lurklb;
  HighsInt step_1;
  HighsInt minlb;
  HighsDomain *in_stack_000000e0;
  double in_stack_000000e8;
  HighsLpRelaxation *in_stack_000000f0;
  HighsInt ub;
  _Self del;
  iterator i;
  iterator it;
  iterator it_1;
  iterator pos;
  bool useful;
  double requiredcutoffbound;
  double fracbound;
  HighsInt lurkub;
  HighsInt step;
  HighsInt maxub;
  HighsInt lb;
  HighsInt col;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  reference in_stack_fffffffffffffe48;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_fffffffffffffe50;
  iterator in_stack_fffffffffffffe58;
  multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
  *in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *in_stack_fffffffffffffe70;
  value_type vVar9;
  _Self local_130;
  _Rb_tree_const_iterator<std::pair<const_double,_int>_> local_128;
  _Self local_120;
  _Self local_118;
  _Self local_110;
  iterator local_108;
  byte local_f9;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  int local_e4;
  int local_e0;
  int local_dc;
  _Base_ptr local_d8;
  undefined8 local_d0;
  int local_c4;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_b0;
  _Self local_a8;
  _Rb_tree_const_iterator<std::pair<const_double,_int>_> local_a0;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  iterator local_80;
  byte local_71;
  double local_70;
  double local_68;
  int local_5c;
  int local_58;
  int local_54;
  _Base_ptr local_50;
  undefined8 local_48;
  int local_40;
  int local_3c;
  int *local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  vector<int,_std::allocator<int>_> *local_28;
  double local_20;
  vector<double,_std::allocator<double>_> *local_18;
  HighsMipSolver *local_10;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  HighsMipSolver::numCol(in_RSI);
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_node);
  HighsMipSolver::numCol(local_10);
  std::
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  ::resize(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_node);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x68b306);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x68b325);
  HighsLpRelaxation::computeBasicDegenerateDuals
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
  pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x68b34f);
  local_28 = &pHVar3->integral_cols;
  local_30._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe48);
  local_38 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe50,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffe48);
    if (!bVar1) {
      return;
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_30);
    local_3c = *piVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c);
    dVar8 = *pvVar5;
    pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x68b3ee);
    if (dVar8 < pHVar3->feastol || dVar8 == pHVar3->feastol) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c);
      vVar9 = *pvVar5;
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x68b906);
      if (vVar9 < -pHVar3->feastol) {
        pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x68b949);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(pHVar3->domain).col_upper_,(long)local_3c);
        local_c4 = (int)*pvVar6;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c);
        if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
          pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x68ba3b);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(pHVar3->domain).col_lower_,(long)local_3c);
          if ((*pvVar6 != -INFINITY) || (NAN(*pvVar6))) {
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x68ba96);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&(pHVar3->domain).col_lower_,(long)local_3c);
            local_dc = (int)(*pvVar6 + 1.5);
          }
          else {
            local_dc = local_c4 + -0x400;
          }
          local_e0 = 1;
          if (0x400 < local_c4 - local_dc) {
            local_e0 = (local_c4 - local_dc) + 0x3ff >> 10;
          }
          for (local_e4 = local_dc; local_e4 <= local_c4; local_e4 = local_e0 + local_e4) {
            in_stack_fffffffffffffe50 =
                 (multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  *)(double)((local_e4 - local_c4) + -1);
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x68bb59);
            in_stack_fffffffffffffe58._M_node =
                 (_Base_ptr)(pHVar3->feastol * 10.0 + (double)in_stack_fffffffffffffe50);
            local_f0 = in_stack_fffffffffffffe58._M_node;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_3c);
            in_stack_fffffffffffffe60 =
                 (multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                  *)((double)in_stack_fffffffffffffe58._M_node * *pvVar5 + local_20);
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x68bbd9);
            in_stack_fffffffffffffe68._M_node =
                 (_Base_ptr)((double)in_stack_fffffffffffffe60 - pHVar3->feastol);
            local_f8 = in_stack_fffffffffffffe68._M_node;
            pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x68bc13);
            if (pHVar3->lower_bound <= (double)in_stack_fffffffffffffe68._M_node) {
              local_f9 = 1;
              std::
              vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
              ::operator[](in_RDI + 1,(long)local_3c);
              local_110._M_node =
                   (_Base_ptr)
                   std::
                   multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::lower_bound(in_stack_fffffffffffffe48,(key_type *)0x68bc5a);
              local_108._M_node = local_110._M_node;
              while( true ) {
                std::
                vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                ::operator[](in_RDI + 1,(long)local_3c);
                local_118._M_node =
                     (_Base_ptr)
                     std::
                     multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                     ::end(in_stack_fffffffffffffe48);
                bVar1 = std::operator!=(&local_110,&local_118);
                if (!bVar1) break;
                ppVar7 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x68bcc0);
                if (local_e4 - local_e0 < ppVar7->second) {
                  local_f9 = 0;
                  break;
                }
                std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                          ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)
                           in_stack_fffffffffffffe50);
              }
              if ((local_f9 & 1) != 0) {
                in_stack_fffffffffffffe48 =
                     std::
                     vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                     ::operator[](in_RDI + 1,(long)local_3c);
                std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::_Rb_tree_const_iterator
                          (&local_128,&local_108);
                local_120._M_node =
                     (_Base_ptr)
                     std::
                     multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                     ::emplace_hint<double&,int&>
                               (in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                                in_stack_fffffffffffffe58._M_node,(int *)in_stack_fffffffffffffe50);
                std::
                vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                ::operator[](in_RDI + 1,(long)local_3c);
                local_130._M_node =
                     (_Base_ptr)
                     std::
                     multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                     ::begin(in_stack_fffffffffffffe48);
                while (bVar1 = std::operator!=(&local_130,&local_120), bVar1) {
                  ppVar7 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                                     ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x68bda5);
                  if (local_e4 < ppVar7->second) {
                    std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                              ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)
                               in_stack_fffffffffffffe50);
                  }
                  else {
                    std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                              ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)
                               in_stack_fffffffffffffe58._M_node,
                               (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
                    std::
                    vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                    ::operator[](in_RDI + 1,(long)local_3c);
                    std::
                    multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                    ::erase_abi_cxx11_(in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
                  }
                }
              }
            }
          }
        }
        else {
          std::
          vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
          ::operator[](in_RDI,(long)local_3c);
          std::
          multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
          clear((multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 *)0x68b9bd);
          std::
          vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
          ::operator[](in_RDI + 1,(long)local_3c);
          std::
          multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
          clear((multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 *)0x68b9db);
          std::
          vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
          ::operator[](in_RDI + 1,(long)local_3c);
          local_d0 = 0xfff0000000000000;
          local_d8 = (_Base_ptr)
                     std::
                     multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                     ::emplace<double,int&>
                               (in_stack_fffffffffffffe58._M_node,
                                (double *)in_stack_fffffffffffffe50,(int *)in_stack_fffffffffffffe48
                               );
        }
      }
    }
    else {
      pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x68b416);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(pHVar3->domain).col_lower_,(long)local_3c);
      local_40 = (int)*pvVar6;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c);
      if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
        pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x68b504);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(pHVar3->domain).col_upper_,(long)local_3c);
        if ((*pvVar6 != INFINITY) || (NAN(*pvVar6))) {
          pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x68b55f);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(pHVar3->domain).col_upper_,(long)local_3c);
          dVar8 = floor(*pvVar6 - 0.5);
          local_54 = (int)dVar8;
        }
        else {
          local_54 = local_40 + 0x400;
        }
        local_58 = 1;
        if (0x400 < local_54 - local_40) {
          local_58 = (local_54 - local_40) + 0x3ff >> 10;
        }
        for (local_5c = local_40; local_5c <= local_54; local_5c = local_58 + local_5c) {
          iVar2 = local_5c - local_40;
          pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x68b62b);
          dVar8 = pHVar3->feastol * -10.0 + (double)(iVar2 + 1);
          local_68 = dVar8;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_3c)
          ;
          dVar8 = dVar8 * *pvVar5 + local_20;
          local_70 = dVar8;
          pHVar3 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x68b6bd);
          if (pHVar3->lower_bound <= dVar8) {
            local_71 = 1;
            std::
            vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
            ::operator[](in_RDI,(long)local_3c);
            local_88._M_node =
                 (_Base_ptr)
                 std::
                 multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                 ::lower_bound(in_stack_fffffffffffffe48,(key_type *)0x68b700);
            local_80._M_node = local_88._M_node;
            while( true ) {
              std::
              vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
              ::operator[](in_RDI,(long)local_3c);
              local_90._M_node =
                   (_Base_ptr)
                   std::
                   multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::end(in_stack_fffffffffffffe48);
              bVar1 = std::operator!=(&local_88,&local_90);
              if (!bVar1) break;
              ppVar7 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                                 ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x68b762);
              if (ppVar7->second < local_5c + local_58) {
                local_71 = 0;
                break;
              }
              std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                        ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)
                         in_stack_fffffffffffffe50);
            }
            if ((local_71 & 1) != 0) {
              std::
              vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
              ::operator[](in_RDI,(long)local_3c);
              std::_Rb_tree_const_iterator<std::pair<const_double,_int>_>::_Rb_tree_const_iterator
                        (&local_a0,&local_80);
              local_98._M_node =
                   (_Base_ptr)
                   std::
                   multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                   ::emplace_hint<double&,int&>
                             (in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                              in_stack_fffffffffffffe58._M_node,(int *)in_stack_fffffffffffffe50);
              std::
              vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
              ::operator[](in_RDI,(long)local_3c);
              local_a8._M_node =
                   (_Base_ptr)
                   std::
                   multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
                   ::begin(in_stack_fffffffffffffe48);
              while (bVar1 = std::operator!=(&local_a8,&local_98), bVar1) {
                ppVar7 = std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator->
                                   ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)0x68b841);
                if (ppVar7->second < local_5c) {
                  std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                            ((_Rb_tree_iterator<std::pair<const_double,_int>_> *)
                             in_stack_fffffffffffffe50);
                }
                else {
                  local_b0 = (_Base_ptr)
                             std::_Rb_tree_iterator<std::pair<const_double,_int>_>::operator++
                                       (in_stack_fffffffffffffe58._M_node,
                                        (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
                  std::
                  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
                  ::operator[](in_RDI,(long)local_3c);
                  local_b8 = local_b0;
                  local_c0 = (_Base_ptr)
                             std::
                             multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                             ::erase_abi_cxx11_(in_stack_fffffffffffffe50,in_stack_fffffffffffffe58)
                  ;
                }
              }
            }
          }
        }
      }
      else {
        std::
        vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
        ::operator[](in_RDI,(long)local_3c);
        std::
        multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
        clear((multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
               *)0x68b48a);
        std::
        vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
        ::operator[](in_RDI + 1,(long)local_3c);
        std::
        multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
        clear((multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>
               *)0x68b4a8);
        std::
        vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
        ::operator[](in_RDI,(long)local_3c);
        local_48 = 0xfff0000000000000;
        local_50 = (_Base_ptr)
                   std::
                   multimap<double,int,std::less<double>,std::allocator<std::pair<double_const,int>>>
                   ::emplace<double,int&>
                             (in_stack_fffffffffffffe58._M_node,(double *)in_stack_fffffffffffffe50,
                              (int *)in_stack_fffffffffffffe48);
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  } while( true );
}

Assistant:

void HighsRedcostFixing::addRootRedcost(const HighsMipSolver& mipsolver,
                                        const std::vector<double>& lpredcost,
                                        double lpobjective) {
  lurkingColLower.resize(mipsolver.numCol());
  lurkingColUpper.resize(mipsolver.numCol());

  mipsolver.mipdata_->lp.computeBasicDegenerateDuals(
      mipsolver.mipdata_->feastol);

  for (HighsInt col : mipsolver.mipdata_->integral_cols) {
    if (lpredcost[col] > mipsolver.mipdata_->feastol) {
      // col <= (cutoffbound - lpobj)/redcost + lb
      // so for lurkub = lb to ub - 1 we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurkub = (cutoffbound - lpobj)/redcost + lb
      //  cutoffbound = (lurkub - lb) * redcost + lpobj
      HighsInt lb = (HighsInt)mipsolver.mipdata_->domain.col_lower_[col];

      if (lpredcost[col] == kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColUpper[col].emplace(-kHighsInf, lb);
        continue;
      }

      HighsInt maxub;
      if (mipsolver.mipdata_->domain.col_upper_[col] == kHighsInf)
        maxub = lb + 1024;
      else
        maxub = (HighsInt)std::floor(
            mipsolver.mipdata_->domain.col_upper_[col] - 0.5);

      HighsInt step = 1;
      if (maxub - lb > 1024) step = (maxub - lb + 1023) >> 10;

      for (HighsInt lurkub = lb; lurkub <= maxub; lurkub += step) {
        double fracbound = (lurkub - lb + 1) - 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColUpper[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColUpper[col].end(); ++it) {
          if (it->second < lurkub + step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColUpper[col].emplace_hint(pos, requiredcutoffbound, lurkub);

        auto i = lurkingColUpper[col].begin();
        while (i != it) {
          if (i->second >= lurkub) {
            auto del = i++;
            lurkingColUpper[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    } else if (lpredcost[col] < -mipsolver.mipdata_->feastol) {
      // col >= (cutoffbound - lpobj)/redcost + ub
      // so for lurklb = lb + 1 to ub we can compute the necessary cutoff
      // bound to reach this bound which is:
      //  lurklb = (cutoffbound - lpobj)/redcost + ub
      //  cutoffbound = (lurklb - ub) * redcost + lpobj

      HighsInt ub = (HighsInt)mipsolver.mipdata_->domain.col_upper_[col];

      if (lpredcost[col] == -kHighsInf) {
        lurkingColUpper[col].clear();
        lurkingColLower[col].clear();
        lurkingColLower[col].emplace(-kHighsInf, ub);
        continue;
      }

      HighsInt minlb;
      if (mipsolver.mipdata_->domain.col_lower_[col] == -kHighsInf)
        minlb = ub - 1024;
      else
        minlb = (HighsInt)(mipsolver.mipdata_->domain.col_lower_[col] + 1.5);

      HighsInt step = 1;
      if (ub - minlb > 1024) step = (ub - minlb + 1023) >> 10;

      for (HighsInt lurklb = minlb; lurklb <= ub; lurklb += step) {
        double fracbound = (lurklb - ub - 1) + 10 * mipsolver.mipdata_->feastol;
        double requiredcutoffbound = fracbound * lpredcost[col] + lpobjective -
                                     mipsolver.mipdata_->feastol;
        if (requiredcutoffbound < mipsolver.mipdata_->lower_bound) continue;
        bool useful = true;

        // check if we already have a better lurking bound stored
        auto pos = lurkingColLower[col].lower_bound(requiredcutoffbound);
        for (auto it = pos; it != lurkingColLower[col].end(); ++it) {
          if (it->second > lurklb - step) {
            useful = false;
            break;
          }
        }

        if (!useful) continue;

        // we have no better lurking bound stored store this lurking bound and
        // check if it dominates one that is already stored
        auto it =
            lurkingColLower[col].emplace_hint(pos, requiredcutoffbound, lurklb);

        auto i = lurkingColLower[col].begin();
        while (i != it) {
          if (i->second <= lurklb) {
            auto del = i++;
            lurkingColLower[col].erase(del);
          } else {
            ++i;
          }
        }
      }
    }
  }
}